

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  stbi_uc *psVar6;
  bool bVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  char *pcVar15;
  int unaff_EBP;
  stbi_uc sVar16;
  uint uVar17;
  stbi_uc *psVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  long *in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_001aeba6:
    a->num_bits = 0;
    a->code_buffer = 0;
    puVar1 = (undefined8 *)(*in_FS_OFFSET + -0x20);
    do {
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar11 = a->num_bits;
      uVar9 = a->code_buffer;
      a->code_buffer = uVar9 >> 1;
      a->num_bits = iVar11 + -1;
      if (iVar11 < 3) {
        stbi__fill_bits(a);
      }
      iVar11 = a->num_bits;
      uVar14 = a->code_buffer;
      a->code_buffer = uVar14 >> 2;
      a->num_bits = iVar11 - 2U;
      switch(uVar14 & 3) {
      case 0:
        uVar14 = iVar11 - 2U & 7;
        if (uVar14 != 0) {
          if (iVar11 < 2) {
            stbi__fill_bits(a);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar14;
          a->num_bits = a->num_bits - uVar14;
        }
        iVar11 = a->num_bits;
        if (iVar11 < 1) {
          uVar20 = 0;
        }
        else {
          uVar14 = a->code_buffer;
          uVar20 = 0;
          iVar22 = iVar11;
          do {
            *(char *)((long)local_814.fast + uVar20) = (char)uVar14;
            uVar20 = uVar20 + 1;
            uVar14 = uVar14 >> 8;
            iVar11 = iVar22 + -8;
            bVar7 = 8 < iVar22;
            iVar22 = iVar11;
          } while (bVar7);
          a->code_buffer = uVar14;
          a->num_bits = iVar11;
        }
        if (iVar11 < 0) {
LAB_001af4e6:
          pcVar15 = "zlib corrupt";
LAB_001af4f6:
          *puVar1 = pcVar15;
        }
        else {
          if ((uint)uVar20 < 4) {
            psVar18 = a->zbuffer;
            psVar6 = a->zbuffer_end;
            uVar20 = uVar20 & 0xffffffff;
            do {
              if (psVar18 < psVar6) {
                a->zbuffer = psVar18 + 1;
                sVar16 = *psVar18;
                psVar18 = psVar18 + 1;
              }
              else {
                sVar16 = '\0';
              }
              *(stbi_uc *)((long)local_814.fast + uVar20) = sVar16;
              uVar20 = uVar20 + 1;
            } while (uVar20 != 4);
          }
          if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_001af4e6;
          uVar20 = (ulong)local_814.fast[0];
          if (a->zbuffer_end < a->zbuffer + uVar20) {
            pcVar15 = "read past buffer";
            goto LAB_001af4f6;
          }
          if ((a->zout + uVar20 <= a->zout_end) ||
             (iVar11 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar11 != 0)) {
            memcpy(a->zout,a->zbuffer,uVar20);
            a->zbuffer = a->zbuffer + uVar20;
            a->zout = a->zout + uVar20;
            goto LAB_001af4a1;
          }
        }
        goto switchD_001aec38_caseD_3;
      case 1:
        iVar11 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar11 == 0) goto switchD_001aec38_caseD_3;
        psVar18 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar22 = 0x20;
        break;
      case 2:
        if (iVar11 < 7) {
          stbi__fill_bits(a);
        }
        iVar11 = a->num_bits;
        uVar14 = a->code_buffer;
        a->code_buffer = uVar14 >> 5;
        a->num_bits = iVar11 + -5;
        if (iVar11 < 10) {
          stbi__fill_bits(a);
        }
        iVar11 = a->num_bits;
        uVar17 = a->code_buffer;
        a->code_buffer = uVar17 >> 5;
        a->num_bits = iVar11 + -5;
        if (iVar11 < 9) {
          stbi__fill_bits(a);
        }
        uVar14 = uVar14 & 0x1f;
        iVar11 = uVar14 + 0x101;
        iVar22 = (uVar17 & 0x1f) + 1;
        uVar17 = a->code_buffer;
        a->code_buffer = uVar17 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        lVar24 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar12 = a->code_buffer;
          a->code_buffer = uVar12 >> 3;
          a->num_bits = a->num_bits + -3;
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar24]] =
               (byte)uVar12 & 7;
          lVar24 = lVar24 + 1;
        } while ((ulong)(uVar17 & 0xf) + 4 != lVar24);
        iVar10 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar10 == 0) goto switchD_001aec38_caseD_3;
        iVar10 = iVar22 + iVar11;
        iVar23 = 0;
        while( true ) {
          if (iVar10 <= iVar23) break;
          if (a->num_bits < 0x10) {
            uVar17 = 0xffffffff;
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
              goto LAB_001aedee;
            }
          }
          else {
LAB_001aedee:
            uVar12 = a->code_buffer;
            uVar8 = local_814.fast[uVar12 & 0x1ff];
            if (uVar8 == 0) {
              uVar8 = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
              uVar17 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
              uVar17 = (uVar17 >> 2 & 0x3333) + (uVar17 & 0x3333) * 4;
              uVar2 = (uVar17 >> 1 & 0x5555) + (uVar17 & 0x5555) * 2;
              lVar24 = 0;
              do {
                lVar19 = lVar24;
                lVar24 = lVar19 + 1;
              } while (local_814.maxcode[lVar19 + 10] <= (int)uVar2);
              uVar17 = 0xffffffff;
              if (((lVar19 + 10U < 0x10) &&
                  (lVar21 = (ulong)local_814.firstsymbol[lVar19 + 10] +
                            ((ulong)(uVar2 >> (7U - (char)lVar24 & 0x1f)) -
                            (ulong)local_814.firstcode[lVar19 + 10]), (int)lVar21 < 0x120)) &&
                 ((ulong)*(byte *)((long)&local_814 + lVar21 + 0x484) - 9 == lVar24)) {
                a->code_buffer = uVar12 >> ((byte)(lVar19 + 10U) & 0x1f);
                a->num_bits = (a->num_bits - (int)lVar24) + -9;
                uVar17 = (uint)*(ushort *)((long)&local_814 + lVar21 * 2 + 0x5a4);
              }
            }
            else {
              a->code_buffer = uVar12 >> ((byte)(uVar8 >> 9) & 0x1f);
              a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
              uVar17 = uVar8 & 0x1ff;
            }
          }
          if (uVar17 < 0x13) {
            if ((int)uVar17 < 0x10) {
              lVar24 = (long)iVar23;
              iVar23 = iVar23 + 1;
              abStack_9e9[lVar24 + 1] = (char)uVar17;
              bVar7 = true;
            }
            else {
              iVar3 = a->num_bits;
              if (uVar17 != 0x11) {
                if (uVar17 != 0x10) {
                  if (iVar3 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar17 = a->code_buffer;
                  a->code_buffer = uVar17 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar17 = (uVar17 & 0x7f) + 0xb;
                  goto LAB_001aef89;
                }
                if (iVar3 < 2) {
                  stbi__fill_bits(a);
                }
                uVar17 = a->code_buffer;
                a->code_buffer = uVar17 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar23 != 0) {
                  uVar17 = (uVar17 & 3) + 3;
                  uVar12 = (uint)abStack_9e9[iVar23];
                  goto LAB_001aef8b;
                }
                *puVar1 = "bad codelengths";
                iVar23 = 0;
                goto LAB_001aeed5;
              }
              if (iVar3 < 3) {
                stbi__fill_bits(a);
              }
              uVar17 = a->code_buffer;
              a->code_buffer = uVar17 >> 3;
              a->num_bits = a->num_bits + -3;
              uVar17 = (uVar17 & 7) + 3;
LAB_001aef89:
              uVar12 = 0;
LAB_001aef8b:
              if (iVar10 - iVar23 < (int)uVar17) goto LAB_001aeed2;
              memset(abStack_9e9 + (long)iVar23 + 1,uVar12,(ulong)uVar17);
              iVar23 = iVar23 + uVar17;
              bVar7 = true;
            }
          }
          else {
LAB_001aeed2:
            *puVar1 = "bad codelengths";
LAB_001aeed5:
            bVar7 = false;
          }
          if (!bVar7) goto switchD_001aec38_caseD_3;
        }
        if (iVar10 != iVar23) {
          *puVar1 = "bad codelengths";
          goto switchD_001aec38_caseD_3;
        }
        iVar11 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar11);
        if (iVar11 == 0) goto switchD_001aec38_caseD_3;
        psVar18 = asStack_8e7 + uVar14;
        unaff_EBP = 0;
        break;
      case 3:
        goto switchD_001aec38_caseD_3;
      }
      iVar11 = stbi__zbuild_huffman(&a->z_distance,psVar18,iVar22);
      if (iVar11 == 0) goto switchD_001aec38_caseD_3;
      pcVar15 = a->zout;
      do {
        if (a->num_bits < 0x10) {
          uVar14 = 0xffffffff;
          if (a->zbuffer < a->zbuffer_end) {
            stbi__fill_bits(a);
            goto LAB_001af048;
          }
        }
        else {
LAB_001af048:
          uVar17 = a->code_buffer;
          uVar8 = (a->z_length).fast[uVar17 & 0x1ff];
          if (uVar8 == 0) {
            uVar8 = (ushort)uVar17 << 8 | (ushort)uVar17 >> 8;
            uVar14 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar14 = (uVar14 >> 2 & 0x3333) + (uVar14 & 0x3333) * 4;
            uVar12 = (uVar14 >> 1 & 0x5555) + (uVar14 & 0x5555) * 2;
            lVar24 = 0;
            do {
              lVar19 = lVar24;
              lVar24 = lVar19 + 1;
            } while ((a->z_length).maxcode[lVar19 + 10] <= (int)uVar12);
            uVar14 = 0xffffffff;
            if (((lVar19 + 10U < 0x10) &&
                (lVar21 = (ulong)(a->z_length).firstsymbol[lVar19 + 10] +
                          ((ulong)(uVar12 >> (7U - (char)lVar24 & 0x1f)) -
                          (ulong)(a->z_length).firstcode[lVar19 + 10]), (int)lVar21 < 0x120)) &&
               ((ulong)*(byte *)((long)a + lVar21 + 0x4b8) - 9 == lVar24)) {
              a->code_buffer = uVar17 >> ((byte)(lVar19 + 10U) & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar24) + -9;
              uVar14 = (uint)*(ushort *)((long)a + lVar21 * 2 + 0x5d8);
            }
          }
          else {
            a->code_buffer = uVar17 >> ((byte)(uVar8 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
            uVar14 = uVar8 & 0x1ff;
          }
        }
        if ((int)uVar14 < 0x100) {
          if ((int)uVar14 < 0) {
LAB_001af341:
            pcVar13 = "bad huffman code";
LAB_001af348:
            *puVar1 = pcVar13;
LAB_001af34b:
            bVar7 = false;
            unaff_EBP = 0;
          }
          else {
            if (a->zout_end <= pcVar15) {
              iVar11 = stbi__zexpand(a,pcVar15,1);
              if (iVar11 == 0) goto LAB_001af34b;
              pcVar15 = a->zout;
            }
            *pcVar15 = (char)uVar14;
            pcVar15 = pcVar15 + 1;
            bVar7 = true;
          }
        }
        else if (uVar14 == 0x100) {
          a->zout = pcVar15;
          unaff_EBP = 1;
          bVar7 = false;
        }
        else {
          uVar20 = (ulong)(uVar14 - 0x101);
          uVar14 = stbi__zlength_base[uVar20];
          if (0xffffffffffffffeb < uVar20 - 0x1c) {
            iVar11 = stbi__zlength_extra[uVar20];
            if (a->num_bits < iVar11) {
              stbi__fill_bits(a);
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> ((byte)iVar11 & 0x1f);
            a->num_bits = a->num_bits - iVar11;
            uVar14 = uVar14 + (~(-1 << ((byte)iVar11 & 0x1f)) & uVar17);
          }
          if (a->num_bits < 0x10) {
            uVar20 = 0xffffffff;
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
              goto LAB_001af1f5;
            }
          }
          else {
LAB_001af1f5:
            uVar17 = a->code_buffer;
            uVar8 = (a->z_distance).fast[uVar17 & 0x1ff];
            if (uVar8 == 0) {
              uVar8 = (ushort)uVar17 << 8 | (ushort)uVar17 >> 8;
              uVar12 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
              uVar12 = (uVar12 >> 2 & 0x3333) + (uVar12 & 0x3333) * 4;
              uVar12 = (uVar12 >> 1 & 0x5555) + (uVar12 & 0x5555) * 2;
              lVar24 = 0;
              do {
                lVar19 = lVar24;
                lVar24 = lVar19 + 1;
              } while ((a->z_distance).maxcode[lVar19 + 10] <= (int)uVar12);
              uVar20 = 0xffffffff;
              if (((lVar19 + 10U < 0x10) &&
                  (lVar21 = (ulong)(a->z_distance).firstsymbol[lVar19 + 10] +
                            ((ulong)(uVar12 >> (7U - (char)lVar24 & 0x1f)) -
                            (ulong)(a->z_distance).firstcode[lVar19 + 10]), (int)lVar21 < 0x120)) &&
                 ((ulong)*(byte *)((long)a + lVar21 + 0xc9c) - 9 == lVar24)) {
                a->code_buffer = uVar17 >> ((byte)(lVar19 + 10U) & 0x1f);
                a->num_bits = (a->num_bits - (int)lVar24) + -9;
                uVar20 = (ulong)*(ushort *)((long)a + lVar21 * 2 + 0xdbc);
              }
            }
            else {
              a->code_buffer = uVar17 >> ((byte)(uVar8 >> 9) & 0x1f);
              a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
              uVar20 = (ulong)(uVar8 & 0x1ff);
            }
          }
          if ((int)uVar20 < 0) goto LAB_001af341;
          iVar11 = stbi__zdist_base[uVar20];
          if (0xffffffffffffffe5 < uVar20 - 0x1e) {
            iVar22 = stbi__zdist_extra[uVar20];
            if (a->num_bits < iVar22) {
              stbi__fill_bits(a);
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> ((byte)iVar22 & 0x1f);
            a->num_bits = a->num_bits - iVar22;
            iVar11 = iVar11 + (~(-1 << ((byte)iVar22 & 0x1f)) & uVar17);
          }
          if ((long)pcVar15 - (long)a->zout_start < (long)iVar11) {
            pcVar13 = "bad dist";
            goto LAB_001af348;
          }
          if (a->zout_end < pcVar15 + (int)uVar14) {
            iVar22 = stbi__zexpand(a,pcVar15,uVar14);
            if (iVar22 == 0) {
              bVar7 = false;
              unaff_EBP = 0;
              goto LAB_001af350;
            }
            pcVar15 = a->zout;
          }
          lVar24 = -(long)iVar11;
          bVar7 = true;
          if (iVar11 == 1) {
            if (uVar14 != 0) {
              memset(pcVar15,(uint)(byte)pcVar15[lVar24],(ulong)uVar14);
              pcVar15 = pcVar15 + (ulong)(uVar14 - 1) + 1;
            }
          }
          else {
            for (; uVar14 != 0; uVar14 = uVar14 - 1) {
              *pcVar15 = pcVar15[lVar24];
              pcVar15 = pcVar15 + 1;
            }
          }
        }
LAB_001af350:
      } while (bVar7);
      if (unaff_EBP == 0) {
        return 0;
      }
LAB_001af4a1:
    } while ((uVar9 & 1) == 0);
    iVar11 = 1;
  }
  else {
    pbVar4 = a->zbuffer;
    pbVar5 = a->zbuffer_end;
    uVar14 = 0;
    uVar9 = 0;
    if (pbVar4 < pbVar5) {
      a->zbuffer = pbVar4 + 1;
      uVar9 = (uint)*pbVar4;
    }
    pbVar4 = a->zbuffer;
    if (pbVar4 < pbVar5) {
      a->zbuffer = pbVar4 + 1;
      uVar14 = (uint)*pbVar4;
    }
    if ((a->zbuffer < pbVar5) && ((uVar9 << 8 | uVar14) * -0x42108421 < 0x8421085)) {
      if ((uVar14 & 0x20) == 0) {
        if ((uVar9 & 0xf) == 8) goto LAB_001aeba6;
        lVar24 = *in_FS_OFFSET;
        pcVar15 = "bad compression";
      }
      else {
        lVar24 = *in_FS_OFFSET;
        pcVar15 = "no preset dict";
      }
    }
    else {
      lVar24 = *in_FS_OFFSET;
      pcVar15 = "bad zlib header";
    }
    *(char **)(lVar24 + -0x20) = pcVar15;
switchD_001aec38_caseD_3:
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}